

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocators.h
# Opt level: O0

void __thiscall
rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>::~MemoryPoolAllocator
          (MemoryPoolAllocator<rapidjson::CrtAllocator> *this)

{
  CrtAllocator *pCVar1;
  CrtAllocator *a;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *this_local;
  
  if (this->shared_ != (SharedData *)0x0) {
    if (this->shared_->refcount < 2) {
      Clear(this);
      pCVar1 = this->shared_->ownBaseAllocator;
      if ((this->shared_->ownBuffer & 1U) != 0) {
        CrtAllocator::Free(this->shared_);
      }
      if (pCVar1 != (CrtAllocator *)0x0) {
        operator_delete(pCVar1);
      }
    }
    else {
      this->shared_->refcount = this->shared_->refcount - 1;
    }
  }
  return;
}

Assistant:

~MemoryPoolAllocator() RAPIDJSON_NOEXCEPT {
        if (!shared_) {
            // do nothing if moved
            return;
        }
        if (shared_->refcount > 1) {
            --shared_->refcount;
            return;
        }
        Clear();
        BaseAllocator *a = shared_->ownBaseAllocator;
        if (shared_->ownBuffer) {
            baseAllocator_->Free(shared_);
        }
        RAPIDJSON_DELETE(a);
    }